

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

ssize_t archive_write_shar_data_uuencode(archive_write *a,void *buff,size_t length)

{
  int iVar1;
  shar *in_RDX;
  archive_write *in_RSI;
  long in_RDI;
  int r_1;
  int r;
  int ret;
  size_t n;
  char *src;
  shar *shar;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  shar *local_38;
  char *inbuf;
  archive_write *a_00;
  shar *local_8;
  
  inbuf = *(char **)(in_RDI + 0xd0);
  if (*(int *)(inbuf + 0x10) == 0) {
    return 0;
  }
  local_38 = in_RDX;
  a_00 = in_RSI;
  if (*(long *)(inbuf + 0x50) != 0) {
    local_38 = (shar *)(0x2d - *(long *)(inbuf + 0x50));
    if (in_RDX < local_38) {
      local_38 = in_RDX;
    }
    memcpy(inbuf + *(long *)(inbuf + 0x50) + 0x20,in_RSI,(size_t)local_38);
    if (local_38->outbuff + *(long *)(inbuf + 0x50) + -0x20 < (char *)0x2d) {
      *(char **)(inbuf + 0x50) = local_38->outbuff + *(long *)(inbuf + 0x50) + -0x20;
      return (ssize_t)in_RDX;
    }
    iVar1 = _uuencode_line(a_00,in_RDX,inbuf,(size_t)in_RSI);
    if (iVar1 != 0) {
      return -0x1e;
    }
    in_RSI = (archive_write *)
             (((shar *)(local_38->outbuff + -0x20))->outbuff + (long)&in_RSI[-1].format_write_header
             );
    local_38 = (shar *)((long)in_RDX - (long)local_38);
    in_stack_ffffffffffffffc0 = 0;
  }
  while( true ) {
    if (local_38 < (shar *)0x2d) {
      local_8 = in_RDX;
      if (local_38 != (shar *)0x0) {
        memcpy(inbuf + 0x20,in_RSI,(size_t)local_38);
        *(shar **)(inbuf + 0x50) = local_38;
        local_8 = in_RDX;
      }
      return (ssize_t)local_8;
    }
    iVar1 = _uuencode_line(a_00,in_RDX,inbuf,(size_t)in_RSI);
    if (iVar1 != 0) break;
    in_RSI = (archive_write *)((long)&(in_RSI->archive).compression_name + 5);
    local_38 = (shar *)((long)&local_38[-1].work.s + 3);
    if (0xffff < *(ulong *)(inbuf + 0x68)) {
      iVar1 = __archive_write_output
                        ((archive_write *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (void *)(ulong)in_stack_ffffffffffffffb8,0x195b97);
      if (iVar1 != 0) {
        return -0x1e;
      }
      inbuf[0x68] = '\0';
      inbuf[0x69] = '\0';
      inbuf[0x6a] = '\0';
      inbuf[0x6b] = '\0';
      inbuf[0x6c] = '\0';
      inbuf[0x6d] = '\0';
      inbuf[0x6e] = '\0';
      inbuf[0x6f] = '\0';
      in_stack_ffffffffffffffc4 = 0;
    }
  }
  return -0x1e;
}

Assistant:

static ssize_t
archive_write_shar_data_uuencode(struct archive_write *a, const void *buff,
    size_t length)
{
	struct shar *shar;
	const char *src;
	size_t n;
	int ret;

	shar = (struct shar *)a->format_data;
	if (!shar->has_data)
		return (ARCHIVE_OK);
	src = (const char *)buff;

	if (shar->outpos != 0) {
		n = 45 - shar->outpos;
		if (n > length)
			n = length;
		memcpy(shar->outbuff + shar->outpos, src, n);
		if (shar->outpos + n < 45) {
			shar->outpos += n;
			return length;
		}
		uuencode_line(a, shar, shar->outbuff, 45);
		src += n;
		n = length - n;
	} else {
		n = length;
	}

	while (n >= 45) {
		uuencode_line(a, shar, src, 45);
		src += 45;
		n -= 45;

		if (shar->work.length < 65536)
			continue;
		ret = __archive_write_output(a, shar->work.s,
		    shar->work.length);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		archive_string_empty(&shar->work);
	}
	if (n != 0) {
		memcpy(shar->outbuff, src, n);
		shar->outpos = n;
	}
	return (length);
}